

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::GetDirFromEnv_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,
          initializer_list<const_char_*> environment_variables,char *fallback,char separator)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  string *psVar4;
  allocator local_8e;
  allocator local_8d [20];
  allocator local_79;
  string local_78 [32];
  char *local_58;
  char *value;
  char *variable_name;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  char *pcStack_28;
  char separator_local;
  char *fallback_local;
  initializer_list<const_char_*> environment_variables_local;
  
  pcStack_28 = (char *)environment_variables._M_len;
  environment_variables_local._M_array = environment_variables._M_array;
  __range1._7_1_ = (char)fallback;
  __begin1 = &fallback_local;
  fallback_local = (char *)this;
  environment_variables_local._M_len = (size_type_conflict)__return_storage_ptr__;
  __end1 = std::initializer_list<const_char_*>::begin((initializer_list<const_char_*> *)__begin1);
  variable_name =
       (char *)std::initializer_list<const_char_*>::end((initializer_list<const_char_*> *)__begin1);
  while( true ) {
    pcVar2 = pcStack_28;
    if (__end1 == (const_iterator)variable_name) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_8e);
      std::allocator<char>::~allocator((allocator<char> *)&local_8e);
      return __return_storage_ptr__;
    }
    value = *__end1;
    pcVar2 = internal::posix::GetEnv(value);
    local_58 = pcVar2;
    if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) break;
    __end1 = __end1 + 1;
  }
  sVar3 = strlen(pcVar2);
  pcVar1 = local_58;
  if (pcVar2[sVar3 - 1] != __range1._7_1_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,pcVar1,&local_79);
    psVar4 = (string *)std::__cxx11::string::append((ulong)local_78,'\x01');
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar4);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    return __return_storage_ptr__;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,local_8d);
  std::allocator<char>::~allocator((allocator<char> *)local_8d);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetDirFromEnv(
    std::initializer_list<const char*> environment_variables,
    const char* fallback, char separator) {
  for (const char* variable_name : environment_variables) {
    const char* value = internal::posix::GetEnv(variable_name);
    if (value != nullptr && value[0] != '\0') {
      if (value[strlen(value) - 1] != separator) {
        return std::string(value).append(1, separator);
      }
      return value;
    }
  }
  return fallback;
}